

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangular.cpp
# Opt level: O0

double __thiscall Rectangular::coordinateY(Rectangular *this,int J,int K,int L,int G)

{
  double dVar1;
  int G_local;
  int L_local;
  int K_local;
  int J_local;
  Rectangular *this_local;
  
  (this->super_Parameterization).x =
       (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
  dVar1 = sqrt((this->super_Parameterization).radius * (this->super_Parameterization).radius +
               -((this->super_Parameterization).x * (this->super_Parameterization).x));
  (this->super_Parameterization).y_lb = -dVar1;
  (this->super_Parameterization).y_ub = -(this->super_Parameterization).y_lb;
  (this->super_Parameterization).dy =
       ((this->super_Parameterization).y_ub - (this->super_Parameterization).y_lb) /
       (double)((this->super_Parameterization).Kmax + -1);
  return (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
}

Assistant:

double Rectangular::coordinateY(int J, int K, int L, int G) {
  x = x_lb + (double)J * dx;

  y_lb = -sqrt(radius * radius - x * x);
  y_ub = -y_lb;

  dy = (y_ub - y_lb) / (double)(Kmax - 1);

  return y_lb + (double)K * dy;
}